

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfCase.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::IfCase::dump_abi_cxx11_
          (string *__return_storage_ptr__,IfCase *this,int level)

{
  ulong uVar1;
  ostream *poVar2;
  pointer pEVar3;
  pointer pBVar4;
  allocator local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240 [32];
  string local_220 [55];
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  int local_1c;
  IfCase *pIStack_18;
  int level_local;
  IfCase *this_local;
  
  local_1c = level;
  pIStack_18 = this;
  this_local = (IfCase *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar1 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,uVar1,'\t',&local_1e9);
  std::operator+(&local_1c8,&local_1e8,"IfCase ");
  poVar2 = std::operator<<(local_198,(string *)&local_1c8);
  pEVar3 = std::
           unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ::operator->(&this->condition);
  (*(pEVar3->super_Statement).super_ASTElement._vptr_ASTElement[3])
            (local_220,pEVar3,(ulong)(local_1c + 1));
  poVar2 = std::operator<<(poVar2,local_220);
  poVar2 = std::operator<<(poVar2," {");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  pBVar4 = std::
           unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ::operator->(&this->body);
  (*(pBVar4->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[3])
            (local_240,pBVar4,(ulong)(local_1c + 1));
  poVar2 = std::operator<<(local_198,local_240);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_240);
  uVar1 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,uVar1,'\t',&local_281);
  std::operator+(&local_260,&local_280,"}");
  poVar2 = std::operator<<(local_198,(string *)&local_260);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::IfCase::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "IfCase " << this->condition->dump(level+1) << " {" << std::endl;
    s << body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}